

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>::
convertTo<QString>(QString *__return_storage_ptr__,
                  QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String>,_QString>
                  *this)

{
  QLatin1String *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  QChar *pQVar6;
  undefined4 in_EAX;
  int iVar7;
  char16_t *pcVar8;
  undefined1 auVar9 [16];
  
  auVar9._0_4_ = -(uint)(*(int *)&(this->a).a.a.m_data == 0 && *(int *)&(this->a).b.m_data == 0);
  auVar9._4_4_ = -(uint)(*(int *)((long)&(this->a).a.a.m_data + 4) == 0 &&
                        *(int *)((long)&(this->a).b.m_data + 4) == 0);
  auVar9._8_4_ = -(uint)((int)(this->a).a.b.d.size == 0 && (int)(this->b).d.size == 0);
  auVar9._12_4_ =
       -(uint)(*(int *)((long)&(this->a).a.b.d.size + 4) == 0 &&
              *(int *)((long)&(this->b).d.size + 4) == 0);
  iVar7 = movmskps(in_EAX,auVar9);
  if (iVar7 == 0xf) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar2 = (this->a).a.b.d.size;
    lVar3 = (this->a).a.a.m_size;
    lVar4 = (this->a).b.m_size;
    lVar5 = (this->b).d.size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar2 + lVar3 + lVar4 + lVar5,Uninitialized);
    pQVar6 = (QChar *)(__return_storage_ptr__->d).ptr;
    lVar2 = (this->a).a.a.m_size;
    QAbstractConcatenable::appendLatin1To((this->a).a.a,pQVar6);
    pQVar6 = pQVar6 + lVar2;
    lVar2 = (this->a).a.b.d.size;
    if (lVar2 != 0) {
      pcVar8 = (this->a).a.b.d.ptr;
      if (pcVar8 == (char16_t *)0x0) {
        pcVar8 = (char16_t *)&QString::_empty;
      }
      memcpy(pQVar6,pcVar8,lVar2 * 2);
    }
    pQVar1 = &(this->a).b;
    lVar3 = pQVar1->m_size;
    QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar6 + lVar2);
    lVar4 = (this->b).d.size;
    if (lVar4 != 0) {
      pcVar8 = (this->b).d.ptr;
      if (pcVar8 == (char16_t *)0x0) {
        pcVar8 = (char16_t *)&QString::_empty;
      }
      memcpy(pQVar6 + lVar2 + lVar3,pcVar8,lVar4 * 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }